

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

void fmt_PrintString(char *buf,size_t bufLen,FormatSpec *fmt,char *value)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  size_t __n_00;
  
  if (fmt->sign != 0) {
    error("Formatting string with sign flag \'%c\'\n");
  }
  if (fmt->prefix == true) {
    error("Formatting string with prefix flag \'#\'\n");
  }
  if (fmt->padZero == true) {
    error("Formatting string with padding flag \'0\'\n");
  }
  if (fmt->hasFrac == true) {
    error("Formatting string with fractional width\n");
  }
  if (fmt->type != 0x73) {
    error("Formatting string as type \'%c\'\n");
  }
  __n = strlen(value);
  uVar2 = fmt->width;
  if (fmt->width <= __n) {
    uVar2 = __n;
  }
  uVar1 = bufLen - 1;
  if ((uVar1 < uVar2) && (error("Formatted string value too long\n"), uVar2 = uVar1, uVar1 <= __n))
  {
    __n = uVar1;
  }
  __n_00 = uVar2 - __n;
  if (((__n <= uVar2) && (uVar2 < bufLen)) && (__n < bufLen)) {
    if (fmt->alignLeft == false) {
      if (uVar2 != __n) {
        memset(buf,0x20,__n_00);
      }
      memcpy(buf + __n_00,value,__n);
    }
    else {
      memcpy(buf,value,__n);
      if (__n < uVar2) {
        memset(buf + __n,0x20,__n_00);
      }
    }
    buf[uVar2] = '\0';
    return;
  }
  __assert_fail("len < bufLen && totalLen < bufLen && len <= totalLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x99,
                "void fmt_PrintString(char *, size_t, const struct FormatSpec *, const char *)");
}

Assistant:

void fmt_PrintString(char *buf, size_t bufLen, struct FormatSpec const *fmt, char const *value)
{
	if (fmt->sign)
		error("Formatting string with sign flag '%c'\n", fmt->sign);
	if (fmt->prefix)
		error("Formatting string with prefix flag '#'\n");
	if (fmt->padZero)
		error("Formatting string with padding flag '0'\n");
	if (fmt->hasFrac)
		error("Formatting string with fractional width\n");
	if (fmt->type != 's')
		error("Formatting string as type '%c'\n", fmt->type);

	size_t len = strlen(value);
	size_t totalLen = fmt->width > len ? fmt->width : len;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted string value too long\n");
		totalLen = bufLen - 1;
		if (len > totalLen)
			len = totalLen;
	}
	assert(len < bufLen && totalLen < bufLen && len <= totalLen);

	size_t padLen = totalLen - len;

	if (fmt->alignLeft) {
		memcpy(buf, value, len);
		for (size_t i = len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		for (size_t i = 0; i < padLen; i++)
			buf[i] = ' ';
		memcpy(buf + padLen, value, len);
	}

	buf[totalLen] = '\0';
}